

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86.h
# Opt level: O0

int x86_simd_caps(void)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  ulong uVar11;
  uint64_t uVar12;
  char *env;
  uint reg_edx;
  uint reg_ecx;
  uint reg_ebx;
  uint reg_eax;
  uint max_cpuid_val;
  uint mask;
  uint flags;
  uint local_14;
  uint local_10;
  uint local_c;
  
  local_14 = 0xffffffff;
  pcVar9 = getenv("AOM_SIMD_CAPS");
  if ((pcVar9 == (char *)0x0) || (*pcVar9 == '\0')) {
    pcVar9 = getenv("AOM_SIMD_CAPS_MASK");
    if ((pcVar9 != (char *)0x0) && (*pcVar9 != '\0')) {
      uVar11 = strtoul(pcVar9,(char **)0x0,0);
      local_14 = (uint)uVar11;
    }
    puVar1 = (uint *)cpuid_basic_info(0);
    uVar8 = *puVar1;
    if (uVar8 == 0) {
      local_c = 0;
    }
    else {
      lVar10 = cpuid_Version_info(1);
      uVar2 = *(uint *)(lVar10 + 8);
      uVar3 = *(uint *)(lVar10 + 0xc);
      uVar4 = 0;
      if ((uVar2 & 0x2000000) == 0x2000000) {
        uVar4 = 2;
      }
      uVar5 = 0;
      if ((uVar2 & 0x4000000) == 0x4000000) {
        uVar5 = 4;
      }
      uVar6 = 0;
      if ((uVar3 & 1) == 1) {
        uVar6 = 8;
      }
      uVar7 = 0;
      if ((uVar3 & 0x200) == 0x200) {
        uVar7 = 0x10;
      }
      local_10 = 0;
      if ((uVar3 & 0x80000) == 0x80000) {
        local_10 = 0x20;
      }
      local_10 = local_10 | uVar7 | uVar6 | uVar5 | uVar4 | (uVar2 & 0x800000) == 0x800000;
      if ((((uVar3 & 0x18000000) == 0x18000000) && (uVar12 = xgetbv(), (uVar12 & 6) == 6)) &&
         (local_10 = local_10 | 0x40, 6 < uVar8)) {
        lVar10 = cpuid_Extended_Feature_Enumeration_info(7);
        uVar8 = 0;
        if ((*(uint *)(lVar10 + 4) & 0x20) == 0x20) {
          uVar8 = 0x80;
        }
        local_10 = uVar8 | local_10;
      }
      local_c = local_10 & local_14;
    }
  }
  else {
    lVar10 = strtol(pcVar9,(char **)0x0,0);
    local_c = (uint)lVar10;
  }
  return local_c;
}

Assistant:

static inline int x86_simd_caps(void) {
  unsigned int flags = 0;
  unsigned int mask = ~0u;
  unsigned int max_cpuid_val, reg_eax, reg_ebx, reg_ecx, reg_edx;
  char *env;

  /* See if the CPU capabilities are being overridden by the environment */
  env = getenv("AOM_SIMD_CAPS");
  if (env && *env) return (int)strtol(env, NULL, 0);

  env = getenv("AOM_SIMD_CAPS_MASK");
  if (env && *env) mask = (unsigned int)strtoul(env, NULL, 0);

  /* Ensure that the CPUID instruction supports extended features */
  cpuid(0, 0, max_cpuid_val, reg_ebx, reg_ecx, reg_edx);

  if (max_cpuid_val < 1) return 0;

  /* Get the standard feature flags */
  cpuid(1, 0, reg_eax, reg_ebx, reg_ecx, reg_edx);

  flags |= FEATURE_SET(reg_edx, MMX) ? HAS_MMX : 0;
  flags |= FEATURE_SET(reg_edx, SSE) ? HAS_SSE : 0;
  flags |= FEATURE_SET(reg_edx, SSE2) ? HAS_SSE2 : 0;
  flags |= FEATURE_SET(reg_ecx, SSE3) ? HAS_SSE3 : 0;
  flags |= FEATURE_SET(reg_ecx, SSSE3) ? HAS_SSSE3 : 0;
  flags |= FEATURE_SET(reg_ecx, SSE4_1) ? HAS_SSE4_1 : 0;

  // bits 27 (OSXSAVE) & 28 (256-bit AVX)
  if (FEATURE_SET(reg_ecx, AVX)) {
    // Check for OS-support of YMM state. Necessary for AVX and AVX2.
    if ((xgetbv() & 0x6) == 0x6) {
      flags |= HAS_AVX;
      if (max_cpuid_val >= 7) {
        /* Get the leaf 7 feature flags. Needed to check for AVX2 support */
        cpuid(7, 0, reg_eax, reg_ebx, reg_ecx, reg_edx);
        flags |= FEATURE_SET(reg_ebx, AVX2) ? HAS_AVX2 : 0;
      }
    }
  }
  (void)reg_eax;  // Avoid compiler warning on unused-but-set variable.
  return flags & mask;
}